

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

void __thiscall
pbrt::Sphere::Sphere
          (Sphere *this,Transform *renderFromObject,Transform *objectFromRender,
          bool reverseOrientation,Float radius,Float zMin,Float zMax,Float phiMax)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar9 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar10 [64];
  
  auVar10._4_60_ = in_register_00001284;
  auVar10._0_4_ = zMax;
  auVar9._4_60_ = in_register_00001244;
  auVar9._0_4_ = zMin;
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = radius;
  auVar6 = auVar7._0_16_;
  this->radius = radius;
  auVar8 = vminss_avx(auVar10._0_16_,auVar9._0_16_);
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(auVar6,auVar1);
  auVar1 = vminss_avx(auVar6,auVar8);
  uVar2 = vcmpss_avx512f(auVar8,auVar4,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  this->zMin = (Float)((uint)bVar3 * auVar4._0_4_ + (uint)!bVar3 * auVar1._0_4_);
  auVar1 = vmaxss_avx(auVar10._0_16_,auVar9._0_16_);
  auVar6 = vminss_avx(auVar6,auVar1);
  uVar2 = vcmpss_avx512f(auVar1,auVar4,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  this->zMax = (Float)((uint)bVar3 * auVar4._0_4_ + (uint)!bVar3 * auVar6._0_4_);
  auVar6._0_4_ = auVar8._0_4_ / radius;
  auVar6._4_12_ = auVar8._4_12_;
  auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar6);
  uVar2 = vcmpss_avx512f(auVar6,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar5 = acosf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar8._0_4_));
  this->thetaZMin = fVar5;
  auVar8 = ZEXT416((uint)(auVar1._0_4_ / radius));
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar8);
  uVar2 = vcmpss_avx512f(auVar8,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar5 = acosf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar1._0_4_));
  this->thetaZMax = fVar5;
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)phiMax));
  uVar2 = vcmpss_avx512f(ZEXT416((uint)phiMax),ZEXT816(0) << 0x40,1);
  this->phiMax = (Float)((uint)!(bool)((byte)uVar2 & 1) * (int)(auVar1._0_4_ * 0.017453292));
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  bVar3 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar3;
  return;
}

Assistant:

Sphere(const Transform *renderFromObject, const Transform *objectFromRender,
           bool reverseOrientation, Float radius, Float zMin, Float zMax, Float phiMax)
        : renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          transformSwapsHandedness(renderFromObject->SwapsHandedness()),
          radius(radius),
          zMin(Clamp(std::min(zMin, zMax), -radius, radius)),
          zMax(Clamp(std::max(zMin, zMax), -radius, radius)),
          thetaZMin(std::acos(Clamp(std::min(zMin, zMax) / radius, -1, 1))),
          thetaZMax(std::acos(Clamp(std::max(zMin, zMax) / radius, -1, 1))),
          phiMax(Radians(Clamp(phiMax, 0, 360))) {}